

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_replace_node(REF_CELL ref_cell,REF_INT old_node,REF_INT new_node)

{
  int reference;
  REF_ADJ pRVar1;
  uint uVar2;
  REF_INT local_44;
  REF_INT local_40;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_ADJ ref_adj;
  REF_INT new_node_local;
  REF_INT old_node_local;
  REF_CELL ref_cell_local;
  
  pRVar1 = ref_cell->ref_adj;
  if (old_node != new_node) {
    if ((old_node < 0) || (pRVar1->nnode <= old_node)) {
      local_40 = -1;
    }
    else {
      local_40 = pRVar1->first[old_node];
    }
    ref_private_macro_code_rss = local_40;
    while (ref_private_macro_code_rss != -1) {
      reference = pRVar1->item[ref_private_macro_code_rss].ref;
      for (cell = 0; cell < ref_cell->node_per; cell = cell + 1) {
        if (old_node == ref_cell->c2n[cell + ref_cell->size_per * reference]) {
          uVar2 = ref_adj_remove(ref_cell->ref_adj,
                                 ref_cell->c2n[cell + ref_cell->size_per * reference],reference);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x344,"ref_cell_replace_node",(ulong)uVar2,"unregister cell");
            return uVar2;
          }
          ref_cell->c2n[cell + ref_cell->size_per * reference] = new_node;
          uVar2 = ref_adj_add(ref_cell->ref_adj,ref_cell->c2n[cell + ref_cell->size_per * reference]
                              ,reference);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x348,"ref_cell_replace_node",(ulong)uVar2,"register cell with id");
            return uVar2;
          }
        }
      }
      if ((old_node < 0) || (pRVar1->nnode <= old_node)) {
        local_44 = -1;
      }
      else {
        local_44 = pRVar1->first[old_node];
      }
      ref_private_macro_code_rss = local_44;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_replace_node(REF_CELL ref_cell, REF_INT old_node,
                                         REF_INT new_node) {
  REF_ADJ ref_adj = ref_cell_adj(ref_cell);
  REF_INT node;
  REF_INT item, cell;

  if (old_node == new_node) return REF_SUCCESS;

  item = ref_adj_first(ref_adj, old_node);
  while (ref_adj_valid(item)) {
    cell = ref_adj_item_ref(ref_adj, item);

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (old_node == ref_cell_c2n(ref_cell, node, cell)) {
        RSS(ref_adj_remove(ref_cell->ref_adj,
                           ref_cell_c2n(ref_cell, node, cell), cell),
            "unregister cell");
        ref_cell_c2n(ref_cell, node, cell) = new_node;
        RSS(ref_adj_add(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                        cell),
            "register cell with id");
      }

    item = ref_adj_first(ref_adj, old_node);
  }

  return REF_SUCCESS;
}